

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_concurrency.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ca88::
ARTConcurrencyTest_ParallelInsertOneTree_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTConcurrencyTest_ParallelInsertOneTree_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  int ops_per_thread;
  int total_keys;
  int thread_count;
  ARTConcurrencyTest_ParallelInsertOneTree_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::preinsert_key_range_to_verifier_only<int>
            (&(this->
              super_ARTConcurrencyTest<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              ).verifier,0,0x400);
  (anonymous_namespace)::
  ARTConcurrencyTest<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
  ::
  parallel_test<4ul,256ul,void(*)(unodb::test::tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>*,unsigned_long,unsigned_long)>
            ((ARTConcurrencyTest<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              *)this,ARTConcurrencyTest<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     ::parallel_insert_thread);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_present_values
            (&(this->
              super_ARTConcurrencyTest<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              ).verifier);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTConcurrencyTest, ParallelInsertOneTree) {
  constexpr auto thread_count = 4;
  constexpr auto total_keys = 1024;
  constexpr auto ops_per_thread = total_keys / thread_count;

  this->verifier.preinsert_key_range_to_verifier_only(0, total_keys);
  this->template parallel_test<thread_count, ops_per_thread>(
      TestFixture::parallel_insert_thread);
  this->verifier.check_present_values();
}